

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

void PEM_dek_info(char *buf,char *type,int len,char *str)

{
  size_t sVar1;
  undefined4 in_register_00000014;
  ulong uVar2;
  ulong local_40;
  size_t i;
  size_t available;
  size_t used;
  char *str_local;
  size_t len_local;
  char *type_local;
  char *buf_local;
  
  uVar2 = CONCAT44(in_register_00000014,len);
  OPENSSL_strlcat(buf,"DEK-Info: ",0x400);
  OPENSSL_strlcat(buf,type,0x400);
  OPENSSL_strlcat(buf,",",0x400);
  sVar1 = strlen(buf);
  if (((uVar2 <= uVar2 << 1) && (uVar2 <= uVar2 * 2 + 2)) && (uVar2 * 2 + 2 <= 0x400 - sVar1)) {
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      buf[sVar1 + local_40 * 2] = "0123456789ABCDEF"[(int)((int)str[local_40] >> 4 & 0xf)];
      buf[sVar1 + local_40 * 2 + 1] = "0123456789ABCDEF"[(int)((int)str[local_40] & 0xf)];
    }
    buf[sVar1 + uVar2 * 2] = '\n';
    buf[sVar1 + uVar2 * 2 + 1] = '\0';
  }
  return;
}

Assistant:

static void PEM_dek_info(char buf[PEM_BUFSIZE], const char *type, size_t len,
                         char *str) {
  static const unsigned char map[17] = "0123456789ABCDEF";

  OPENSSL_strlcat(buf, "DEK-Info: ", PEM_BUFSIZE);
  OPENSSL_strlcat(buf, type, PEM_BUFSIZE);
  OPENSSL_strlcat(buf, ",", PEM_BUFSIZE);

  const size_t used = strlen(buf);
  const size_t available = PEM_BUFSIZE - used;
  if (len * 2 < len || len * 2 + 2 < len || available < len * 2 + 2) {
    return;
  }

  for (size_t i = 0; i < len; i++) {
    buf[used + i * 2] = map[(str[i] >> 4) & 0x0f];
    buf[used + i * 2 + 1] = map[(str[i]) & 0x0f];
  }
  buf[used + len * 2] = '\n';
  buf[used + len * 2 + 1] = '\0';
}